

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O2

void ctemplate::CreateOrCleanTestDir(string *dirname)

{
  DIR *__dirp;
  dirent *pdVar1;
  char *pcVar2;
  allocator local_71;
  string local_70 [32];
  char *local_50 [4];
  
  __dirp = opendir((dirname->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar1 = readdir(__dirp);
      if (pdVar1 == (dirent *)0x0) break;
      pcVar2 = strstr(pdVar1->d_name,"template");
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::string(local_70,pdVar1->d_name,&local_71);
        ctemplate::PathJoin((string *)local_50,(string *)dirname);
        unlink(local_50[0]);
        std::__cxx11::string::~string((string *)local_50);
        std::__cxx11::string::~string(local_70);
      }
    }
    closedir(__dirp);
    return;
  }
  mkdir((dirname->_M_dataplus)._M_p,0x1ed);
  return;
}

Assistant:

void CreateOrCleanTestDir(const string& dirname) {
  DIR* dir = opendir(dirname.c_str());
  if (!dir) {   // directory doesn't exist or something like that
    mkdir(dirname.c_str(), 0755);   // make the dir if we can
    return;
  }
  while (struct dirent* d = readdir(dir)) {
    if (strstr(d->d_name, "template"))
      unlink(PathJoin(dirname, d->d_name).c_str());
  }
  closedir(dir);
}